

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

void __thiscall
module_subset_csv_actions::from_path
          (module_subset_csv_actions *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *path)

{
  ostream *poVar1;
  pointer pbVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&this->module_);
  std::operator<<(poVar1,(string *)&s_csv_separator_abi_cxx11_);
  for (pbVar2 = (path->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != (path->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    if (pbVar2 != (path->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start) {
      std::operator<<((ostream *)&std::cout," -> ");
    }
    std::operator<<((ostream *)&std::cout,(string *)pbVar2);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  return;
}

Assistant:

void from_path( std::vector<std::string> const & path )
    {
        std::cout << module_ << s_csv_separator;

        for( std::vector<std::string>::const_iterator i = path.begin(); i != path.end(); ++i )
        {
            if( i != path.begin() )
            {
                std::cout << " -> ";
            }
            std::cout << *i;
        }
        std::cout << "\n";
    }